

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseFieldList
          (WastParser *this,vector<wabt::Field,_std::allocator<wabt::Field>_> *fields)

{
  bool bVar1;
  Result result;
  bool local_59;
  undefined1 local_48 [8];
  Field field;
  vector<wabt::Field,_std::allocator<wabt::Field>_> *fields_local;
  WastParser *this_local;
  
  field._32_8_ = fields;
  do {
    bVar1 = PeekMatch(this,First_Type);
    local_59 = true;
    if (!bVar1) {
      local_59 = PeekMatch(this,Lpar);
    }
    if (local_59 == false) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Field::Field((Field *)local_48);
    result = ParseField(this,(Field *)local_48);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::vector<wabt::Field,_std::allocator<wabt::Field>_>::push_back
                ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)field._32_8_,
                 (value_type *)local_48);
    }
    Field::~Field((Field *)local_48);
  } while (!bVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseFieldList(std::vector<Field>* fields) {
  WABT_TRACE(ParseFieldList);
  while (PeekMatch(TokenType::ValueType) || PeekMatch(TokenType::Lpar)) {
    Field field;
    CHECK_RESULT(ParseField(&field));
    fields->push_back(field);
  }
  return Result::Ok;
}